

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::renderTexture2DView
               (TestContext *testContext,RenderContext *renderContext,TextureRenderer *renderer,
               ResultCollector *results,Random *rng,deUint32 name,ImageInfo *info,
               Texture2DView *refTexture,Verify verify)

{
  ostringstream *this;
  char *imageSetName;
  char *imageSetDesc;
  undefined4 x;
  undefined4 y;
  uint uVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_02;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TextureFormat log;
  ulong uVar9;
  RGBA threshold;
  IVec2 origin;
  IVec2 cellOrigin;
  IVec4 boundingBox;
  TextureImageIterator imageIterator;
  IVec2 levelSize;
  vector<float,_std::allocator<float>_> texCoord;
  RandomizedRenderGrid renderGrid;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  cellContents;
  TextureFormat format;
  TextureFormatInfo spec;
  uint local_3ec;
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [24];
  uint local_398;
  int local_388;
  Vector<int,_3> local_384;
  int local_378;
  int local_374;
  PixelBufferAccess local_370;
  long local_348;
  deRandom *local_340;
  TextureFormat local_338;
  ResultCollector *local_330;
  TextureRenderer *local_328;
  IVec2 local_320;
  undefined1 local_318 [16];
  pointer local_308;
  RandomizedRenderGrid local_2f0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  local_2c8;
  TextureFormat local_2b0;
  RGBA local_2a8 [4];
  ImageInfo local_298;
  ReferenceParams local_284;
  TextureFormatInfo local_1f0;
  undefined1 local_1b0 [384];
  long lVar7;
  
  log = (TextureFormat)testContext->m_log;
  local_340 = &rng->m_rnd;
  local_330 = results;
  local_328 = renderer;
  iVar4 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar7 = CONCAT44(extraout_var,iVar4);
  local_2b0 = refTexture->m_levels->m_format;
  tcu::getTextureFormatInfo(&local_1f0,&local_2b0);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_284,TEXTURETYPE_2D);
  ImageInfo::ImageInfo(&local_298,info);
  iVar4 = getLevelCount(info);
  TextureImageIterator::TextureImageIterator
            ((TextureImageIterator *)(local_3b0 + 0x10),&local_298,iVar4);
  local_284.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(local_2b0);
  local_284.sampler.wrapS = CLAMP_TO_EDGE;
  local_284.sampler.wrapT = CLAMP_TO_EDGE;
  local_284.sampler.wrapR = CLAMP_TO_EDGE;
  local_284.sampler.minFilter = NEAREST_MIPMAP_NEAREST;
  local_284.sampler.magFilter = NEAREST;
  local_284.sampler.lodThreshold = 0.0;
  local_284.sampler.normalizedCoords = true;
  local_284.sampler.compare = COMPAREMODE_NONE;
  local_284.sampler.compareChannel = 0;
  local_284.sampler.borderColor.v._0_8_ = 0;
  local_284.sampler.borderColor.v._8_8_ = 0;
  local_284.sampler.seamlessCubeMap = false;
  local_284.sampler._53_3_ = 0;
  local_284.sampler.depthStencilMode = MODE_DEPTH;
  local_284.super_RenderParams.colorScale.m_data[0] = local_1f0.lookupScale.m_data[0];
  local_284.super_RenderParams.colorScale.m_data[1] = local_1f0.lookupScale.m_data[1];
  local_284.super_RenderParams.colorScale.m_data[2] = local_1f0.lookupScale.m_data[2];
  local_284.super_RenderParams.colorScale.m_data[3] = local_1f0.lookupScale.m_data[3];
  local_284.super_RenderParams.colorBias.m_data[0] = local_1f0.lookupBias.m_data[0];
  local_284.super_RenderParams.colorBias.m_data[1] = local_1f0.lookupBias.m_data[1];
  local_284.super_RenderParams.colorBias.m_data[2] = local_1f0.lookupBias.m_data[2];
  local_284.super_RenderParams.colorBias.m_data[3] = local_1f0.lookupBias.m_data[3];
  (**(code **)(lVar7 + 8))(0x84c0);
  (**(code **)(lVar7 + 0xb8))(0xde1,name);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Failed to bind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x4df);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
  local_348 = lVar7;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Failed to setup texture filtering state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x4e5);
  iVar4 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  local_1b0._0_4_ =
       tcu::PixelFormat::getColorThreshold
                 ((PixelFormat *)((int (*) [2])CONCAT44(extraout_var_00,iVar4) + 1));
  local_2f0.m_targetSize.m_data[0] = 0x1010101;
  tcu::operator+((RGBA *)local_1b0,(RGBA *)&local_2f0);
  iVar6 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar7 = CONCAT44(extraout_var_01,iVar6);
  local_320.m_data = *(int (*) [2])CONCAT44(extraout_var_00,iVar4);
  local_338 = log;
  do {
    if ((local_374 + -1 <= local_388) && (local_3b0._16_4_ + -1 <= local_378)) {
      (**(code **)(lVar7 + 0x1360))(local_398,0x813c,0);
      (**(code **)(lVar7 + 0x1360))(local_398,0x813d,1000);
      lVar7 = local_348;
      (**(code **)(local_348 + 0xb8))(0xde1,0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Failed to unbind texture.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x4ea);
      return;
    }
    iVar4 = local_3b0._16_4_ * (local_374 - local_388);
    tcu::Vector<int,_3>::toWidth<2>(&local_384);
    dVar5 = deRandom_getUint32(local_340);
    uVar9 = (ulong)dVar5;
    RandomizedRenderGrid::RandomizedRenderGrid(&local_2f0,&local_320,(IVec2 *)local_1b0,iVar4,dVar5)
    ;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
    ::vector(&local_2c8,(long)local_2f0.m_cellCount,__a);
    pCVar2 = local_2c8.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3ec = 0;
    while( true ) {
      if (local_2f0.m_cellCount <= local_2f0.m_currentCell) break;
      local_2f0.m_currentCell = local_2f0.m_currentCell + 1;
      bVar3 = TextureImageIterator::nextImage((TextureImageIterator *)(local_3b0 + 0x10));
      iVar4 = local_388;
      if (!bVar3) break;
      tcu::Vector<int,_3>::toWidth<2>(&local_384);
      RandomizedRenderGrid::getOrigin((RandomizedRenderGrid *)local_3d0);
      local_308 = (pointer)0x0;
      local_318._0_4_ = R;
      local_318._4_4_ = SNORM_INT8;
      local_318._8_8_ = (pointer)0x0;
      local_284.baseLevel = iVar4;
      local_284.maxLevel = iVar4;
      (**(code **)(lVar7 + 0x1360))(local_398,0x813c,iVar4);
      (**(code **)(lVar7 + 0x1360))(local_398,0x813d,iVar4);
      computeQuadTexCoords
                ((vector<float,_std::allocator<float>_> *)local_318,
                 (TextureImageIterator *)(local_3b0 + 0x10));
      (**(code **)(lVar7 + 0x1a00))
                (local_3d0._0_4_,local_3d0._4_4_,
                 local_370.super_ConstPixelBufferAccess.m_format.order,
                 local_370.super_ConstPixelBufferAccess.m_format.type);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_328,0,(float *)local_318._0_8_,&local_284.super_RenderParams);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Failed to render.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x499);
      iVar6 = local_378;
      uVar1 = local_398;
      if (verify == VERIFY_COMPARE_REFERENCE) {
        lVar8 = (long)(int)local_3ec;
        *(ulong *)pCVar2[lVar8].origin.m_data = CONCAT44(local_3d0._4_4_,local_3d0._0_4_);
        Functional::(anonymous_namespace)::getTextureImageName_abi_cxx11_
                  ((string *)local_1b0,(_anonymous_namespace_ *)(ulong)local_398,iVar4,local_378,
                   (int)uVar9);
        std::__cxx11::string::operator=((string *)&pCVar2[lVar8].name,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
                  ((string *)local_1b0,(_anonymous_namespace_ *)(ulong)uVar1,iVar4,iVar6,(int)uVar9)
        ;
        std::__cxx11::string::operator=((string *)&pCVar2[lVar8].description,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        tcu::Surface::setSize
                  (&pCVar2[lVar8].reference,local_370.super_ConstPixelBufferAccess.m_format.order,
                   local_370.super_ConstPixelBufferAccess.m_format.type);
        iVar4 = (*renderContext->_vptr_RenderContext[4])();
        tcu::SurfaceAccess::SurfaceAccess
                  ((SurfaceAccess *)local_1b0,&pCVar2[lVar8].reference,
                   (PixelFormat *)(CONCAT44(extraout_var_02,iVar4) + 8));
        glu::TextureTestUtil::sampleTexture
                  ((SurfaceAccess *)local_1b0,refTexture,(float *)local_318._0_8_,&local_284);
        local_3ec = local_3ec + 1;
        log = local_338;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)local_318);
    }
    if (0 < (int)local_3ec) {
      RandomizedRenderGrid::getUsedAreaBoundingBox((RandomizedRenderGrid *)local_3b0);
      tcu::Surface::Surface((Surface *)local_3d0,local_3b0._8_4_,local_3b0._12_4_);
      y = local_3b0._4_4_;
      x = local_3b0._0_4_;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,(Surface *)local_3d0);
      glu::readPixels(renderContext,x,y,(PixelBufferAccess *)local_1b0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Failed to read pixels.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x4b2);
      uVar9 = (ulong)local_3ec;
      __rhs = &pCVar2->description;
      while( true ) {
        bVar3 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar3) break;
        tcu::Vector<int,_4>::toWidth<2>((Vector<int,_4> *)local_3b0);
        tcu::operator-((Vector<int,_2> *)(__rhs + -2),(Vector<int,_2> *)local_1b0);
        tcu::Surface::getAccess(&local_370,(Surface *)local_3d0);
        tcu::getSubregion((PixelBufferAccess *)local_1b0,&local_370,local_3d0._24_4_,
                          local_3d0._28_4_,(int)__rhs[-2]._M_string_length,
                          *(int *)((long)&__rhs[-2]._M_string_length + 4));
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_318,(ConstPixelBufferAccess *)local_1b0);
        imageSetName = __rhs[-1]._M_dataplus._M_p;
        imageSetDesc = (__rhs->_M_dataplus)._M_p;
        tcu::Surface::getAccess
                  ((ConstPixelBufferAccess *)local_1b0,(Surface *)&__rhs[-2]._M_string_length);
        tcu::RGBA::toIVec(local_2a8);
        tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_370);
        bVar3 = tcu::intThresholdCompare
                          ((TestLog *)log,imageSetName,imageSetDesc,
                           (ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)local_318,
                           (UVec4 *)&local_370,COMPARE_LOG_ON_ERROR);
        if (bVar3) {
          this = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"Image comparison of ");
          std::operator<<((ostream *)this,(string *)__rhs);
          std::operator<<((ostream *)this," passed.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_370,"Image comparison of ",__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_370," failed.");
          tcu::ResultCollector::fail
                    (local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0)
          ;
          std::__cxx11::string::~string((string *)local_1b0);
          std::__cxx11::string::~string((string *)&local_370);
        }
        __rhs = __rhs + 3;
      }
      tcu::Surface::~Surface((Surface *)local_3d0);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
    ::~vector(&local_2c8);
  } while( true );
}

Assistant:

void renderTexture2DView (tcu::TestContext&			testContext,
						  glu::RenderContext&		renderContext,
						  TextureRenderer&			renderer,
						  tcu::ResultCollector&		results,
						  de::Random&				rng,
						  deUint32					name,
						  const ImageInfo&			info,
						  const tcu::Texture2DView&	refTexture,
						  Verify					verify)
{
	tcu::TestLog&					log				= testContext.getLog();
	const glw::Functions&			gl				= renderContext.getFunctions();
	const tcu::TextureFormat		format			= refTexture.getLevel(0).getFormat();
	const tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(format);

	ReferenceParams					renderParams	(TEXTURETYPE_2D);
	TextureImageIterator			imageIterator	(info, getLevelCount(info));

	renderParams.samplerType	= getSamplerType(format);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST_MIPMAP_NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind texture.");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup texture filtering state.");

	renderTexture<tcu::Texture2DView>(renderContext, renderer, renderParams, results, rng, refTexture, verify, imageIterator, log);

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind texture.");
}